

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall
Lib::Array<Parse::TPTP::Token>::expandToFit(Array<Parse::TPTP::Token> *this,size_t n)

{
  uint uVar1;
  Token *pTVar2;
  Token *pTVar3;
  ulong uVar4;
  size_t length;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  Token *res;
  
  uVar4 = this->_capacity * 2;
  uVar7 = n + 1;
  if (n < uVar4) {
    uVar7 = uVar4;
  }
  uVar5 = uVar7 * 0x28 + 0xf & 0xfffffffffffffff0;
  uVar4 = uVar7;
  if (uVar5 == 0) {
    pTVar2 = (Token *)FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    pTVar3 = pTVar2;
  }
  else if (uVar5 < 0x11) {
    pTVar2 = (Token *)FixedSizeAllocator<16UL>::alloc
                                ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
    ;
    pTVar3 = pTVar2;
  }
  else if (uVar5 < 0x19) {
    pTVar2 = (Token *)FixedSizeAllocator<24UL>::alloc
                                ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30))
    ;
    pTVar3 = pTVar2;
  }
  else if (uVar5 < 0x21) {
    pTVar2 = (Token *)FixedSizeAllocator<32UL>::alloc
                                ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48))
    ;
    pTVar3 = pTVar2;
  }
  else if (uVar5 < 0x31) {
    pTVar2 = (Token *)FixedSizeAllocator<48UL>::alloc
                                ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60))
    ;
    pTVar3 = pTVar2;
  }
  else if (uVar5 < 0x41) {
    pTVar2 = (Token *)FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78))
    ;
    pTVar3 = pTVar2;
  }
  else {
    pTVar2 = (Token *)::operator_new(uVar5,0x10);
    pTVar3 = pTVar2;
  }
  for (; uVar4 != 0; uVar4 = uVar4 - 1) {
    *(undefined8 *)pTVar2 = 0;
    (pTVar2->content)._M_dataplus._M_p = (pointer)0x0;
    (pTVar2->content)._M_string_length = 0;
    (pTVar2->content).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pTVar2->content).field_2 + 8) = 0;
    (pTVar2->content)._M_dataplus._M_p = (pointer)&(pTVar2->content).field_2;
    pTVar2 = pTVar2 + 1;
  }
  length = this->_capacity;
  if (length == 0) {
    length = 0;
  }
  else {
    uVar1 = (int)length - 1;
    if (-1 < (int)uVar1) {
      lVar6 = (ulong)uVar1 * 0x28;
      do {
        *(undefined4 *)((long)&pTVar3->tag + lVar6) =
             *(undefined4 *)((long)&this->_array->tag + lVar6);
        std::__cxx11::string::_M_assign
                  ((string *)((long)&(pTVar3->content)._M_dataplus._M_p + lVar6));
        lVar6 = lVar6 + -0x28;
      } while (lVar6 != -0x28);
      length = this->_capacity;
    }
  }
  if (this->_array != (Token *)0x0) {
    array_delete<Parse::TPTP::Token>(this->_array,length);
    length = this->_capacity;
    pTVar2 = this->_array;
    if (pTVar2 != (Token *)0x0) {
      uVar4 = length * 0x28 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        *(undefined8 *)pTVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pTVar2;
      }
      else if (uVar4 < 0x11) {
        *(undefined8 *)pTVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pTVar2;
      }
      else if (uVar4 < 0x19) {
        *(undefined8 *)pTVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pTVar2;
      }
      else if (uVar4 < 0x21) {
        *(undefined8 *)pTVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pTVar2;
      }
      else if (uVar4 < 0x31) {
        *(undefined8 *)pTVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pTVar2;
      }
      else if (uVar4 < 0x41) {
        *(undefined8 *)pTVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pTVar2;
      }
      else {
        operator_delete(pTVar2,0x10);
        length = this->_capacity;
      }
    }
  }
  this->_array = pTVar3;
  (**this->_vptr_Array)(this,length,uVar7);
  this->_capacity = uVar7;
  return;
}

Assistant:

void expandToFit (size_t n)
  {
    ASS(n >= _capacity);

    // determine new capacity (at least double the old one)
    size_t newCapacity = 2 * _capacity;
    if (newCapacity <= n) {
      newCapacity = n+1;
    }

    // allocate new array and copy old array's content to the new place
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"Array<>");
    C* newArray = array_new<C>(mem, newCapacity);
    if(_capacity) {
      for (int i = _capacity-1;i >= 0;i--) {
	newArray[i] = _array[i];
      }
    }

    if(_array) {
      // deallocate the old array
      array_delete(_array,_capacity);
      DEALLOC_KNOWN(_array,_capacity*sizeof(C),"Array<>");
    }

    _array = newArray;
    fillInterval(_capacity,newCapacity);
    _capacity = newCapacity;
  }